

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.h
# Opt level: O1

string * __thiscall
cmGlobalNinjaGenerator::BuildAlias
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *alias,string *param_2
          )

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (alias->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + alias->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string BuildAlias(const std::string& alias,
                                 const std::string& /*config*/) const
  {
    return alias;
  }